

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O2

void Mop_ManPrintOne(Mop_Man_t *p,int iCube)

{
  word *pwVar1;
  word *pwVar2;
  byte bVar3;
  ulong uVar4;
  uint uVar5;
  
  pwVar1 = Mop_ManCubeIn(p,iCube);
  pwVar2 = Mop_ManCubeOut(p,iCube);
  bVar3 = 0;
  for (uVar5 = 0; (int)uVar5 < p->nIns; uVar5 = uVar5 + 1) {
    putchar((int)(char)(&DAT_007b54b0)[(uint)(pwVar1[uVar5 >> 5] >> (bVar3 & 0x3e)) & 3]);
    bVar3 = bVar3 + 2;
  }
  putchar(0x20);
  for (uVar4 = 0; (int)uVar4 < p->nOuts; uVar4 = (ulong)((int)uVar4 + 1)) {
    printf("%d",(ulong)((pwVar2[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0));
  }
  putchar(10);
  return;
}

Assistant:

void Mop_ManPrintOne( Mop_Man_t * p, int iCube )
{
    int k;
    char Symb[4] = { '-', '0', '1', '?' };
    word * pCubeIn  = Mop_ManCubeIn( p, iCube );
    word * pCubeOut = Mop_ManCubeOut( p, iCube );
    for ( k = 0; k < p->nIns; k++ )
        printf( "%c", Symb[Abc_TtGetQua(pCubeIn, k)] );
    printf( " " );
    for ( k = 0; k < p->nOuts; k++ )
        printf( "%d", Abc_TtGetBit(pCubeOut, k) );
    printf( "\n" );
}